

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sensors_analytics_sdk.cpp
# Opt level: O0

uchar sensors_analytics::utils::DecimalFromHex(uchar x)

{
  uchar local_a;
  uchar y;
  uchar x_local;
  
  local_a = '\0';
  if ((x < 0x41) || (0x5a < x)) {
    if ((x < 0x61) || (0x7a < x)) {
      if ((0x2f < x) && (x < 0x3a)) {
        local_a = x + 0xd0;
      }
    }
    else {
      local_a = x + 0xa9;
    }
  }
  else {
    local_a = x + 0xc9;
  }
  return local_a;
}

Assistant:

unsigned char DecimalFromHex(unsigned char x) {
    unsigned char y = '\0';
    if (x >= 'A' && x <= 'Z') y = x - 'A' + 10;
    else if (x >= 'a' && x <= 'z') y = x - 'a' + 10;
    else if (x >= '0' && x <= '9') y = x - '0';
    return y;
}